

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resampleMOD.cpp
# Opt level: O3

void __thiscall
WDL_Resampler::WDL_Resampler_Filter::ApplyIIRFade
          (WDL_Resampler_Filter *this,WDL_ResampleSample *out1,int ns,int span,double *hsave,
          double v0,double dv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  dVar10 = *hsave;
  dVar9 = hsave[1];
  dVar11 = hsave[2];
  dVar7 = hsave[3];
  if (ns != 0) {
    dVar1 = this->m_b0;
    dVar2 = this->m_b1;
    dVar3 = this->m_b2;
    dVar4 = this->m_a1;
    dVar5 = this->m_a2;
    dVar6 = dVar7;
    dVar8 = dVar9;
    do {
      dVar7 = dVar11;
      dVar9 = dVar10;
      dVar10 = (double)*out1;
      dVar6 = ((dVar10 * dVar1 + dVar2 * dVar9 + dVar8 * dVar3) - dVar7 * dVar4) - dVar6 * dVar5;
      dVar11 = 0.0;
      if (((ulong)dVar6 & 0x7ff0000000000000) != 0) {
        dVar11 = dVar6;
      }
      *out1 = (float)(dVar11 * v0 + (1.0 - v0) * dVar10);
      out1 = out1 + span;
      v0 = v0 + dv;
      ns = ns + -1;
      dVar6 = dVar7;
      dVar8 = dVar9;
    } while (ns != 0);
  }
  *hsave = dVar10;
  hsave[1] = dVar9;
  hsave[2] = dVar11;
  hsave[3] = dVar7;
  return;
}

Assistant:

void ApplyIIRFade(WDL_ResampleSample *out1, int ns, int span, double *hsave, double v0, double dv)
  {
    double b0=m_b0,b1=m_b1,b2=m_b2,a1=m_a1,a2=m_a2;
    double hist[4];
    memcpy(hist,hsave, sizeof(hist));
    while (ns--)
    {
      double in=*out1;
      double out = (double) ( in*b0 + hist[0]*b1 + hist[1]*b2 - hist[2]*a1 - hist[3]*a2);
      hist[1]=hist[0]; hist[0]=in;
      hist[3]=hist[2];
      *out1 = (hist[2] = denormal_filter_double(out)) * v0 + in * (1.0-v0);
      v0 += dv;
      out1+=span;
    }
    memcpy(hsave, hist, sizeof(hist));
  }